

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O2

int __thiscall
Assimp::JoinVerticesProcess::ProcessMesh(JoinVerticesProcess *this,aiMesh *pMesh,uint meshIndex)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  pointer pvVar3;
  uint uVar4;
  aiFace *paVar5;
  SharedPostProcessInfo *this_00;
  pointer ppVar6;
  aiAnimMesh *paVar7;
  pointer pVVar8;
  aiBone *paVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *__src;
  uint a_13;
  uint uVar13;
  iterator iVar14;
  Logger *pLVar15;
  ostream *this_01;
  aiVector3D *paVar16;
  aiColor4D *paVar17;
  aiVertexWeight *paVar18;
  uint a_2;
  long lVar19;
  long lVar20;
  uint a;
  ulong uVar21;
  uint b;
  ulong uVar22;
  aiMesh *this_02;
  char *pcVar23;
  uint *puVar24;
  uint animMeshIndex_1;
  long lVar25;
  uint animMeshIndex_2;
  long lVar26;
  ulong uVar27;
  uint animMeshIndex;
  bool bVar28;
  uint local_3c4;
  uint *local_3c0;
  aiMesh *local_3b8;
  ulong local_3b0;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> uniqueVertices;
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  uniqueAnimatedVertices;
  pointer local_358;
  vector<unsigned_int,_std::allocator<unsigned_int>_> replaceIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  usedVertexIndices;
  SpatialSort _vertexFinder;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *avf;
  pointer paStack_2b0;
  pointer local_2a8;
  Vertex aniMeshVertex;
  
  uVar13 = 0;
  if (((pMesh->mNumVertices != 0 && pMesh->mVertices != (aiVector3D *)0x0) &&
      (uVar13 = 0, pMesh->mFaces != (aiFace *)0x0)) && (pMesh->mNumFaces != 0)) {
    local_3b0 = CONCAT44(local_3b0._4_4_,meshIndex);
    usedVertexIndices._M_h._M_buckets = &usedVertexIndices._M_h._M_single_bucket;
    usedVertexIndices._M_h._M_bucket_count = 1;
    usedVertexIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    usedVertexIndices._M_h._M_element_count = 0;
    usedVertexIndices._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    usedVertexIndices._M_h._M_rehash_policy._M_next_resize = 0;
    usedVertexIndices._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::__detail::
    _Rehash_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
    ::reserve((_Rehash_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
               *)&usedVertexIndices,(ulong)pMesh->mNumVertices);
    local_3c0 = &pMesh->mNumVertices;
    local_3b8 = pMesh;
    for (uVar21 = 0; this_02 = local_3b8, puVar24 = local_3c0, uVar21 < local_3b8->mNumFaces;
        uVar21 = uVar21 + 1) {
      paVar5 = local_3b8->mFaces;
      lVar25 = 0;
      for (uVar22 = 0; uVar22 < paVar5[uVar21].mNumIndices; uVar22 = uVar22 + 1) {
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&usedVertexIndices,(value_type *)((long)paVar5[uVar21].mIndices + lVar25));
        lVar25 = lVar25 + 4;
      }
    }
    uniqueVertices.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uniqueVertices.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uniqueVertices.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
              (&uniqueVertices,(ulong)*local_3c0);
    avf = (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
           *)CONCAT44(avf._4_4_,0xffffffff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&replaceIndex,(ulong)*puVar24,(value_type_conflict1 *)&avf,
               (allocator_type *)&aniMeshVertex);
    local_358 = (pointer)&_vertexFinder;
    SpatialSort::SpatialSort((SpatialSort *)local_358);
    this_00 = (this->super_BaseProcess).shared;
    uVar21 = local_3b0 & 0xffffffff;
    if (((this_00 == (SharedPostProcessInfo *)0x0) ||
        (SharedPostProcessInfo::
         GetProperty<std::vector<std::pair<Assimp::SpatialSort,float>,std::allocator<std::pair<Assimp::SpatialSort,float>>>>
                   (this_00,"$Spat",&avf),
        avf == (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                *)0x0)) ||
       (ppVar6 = (avf->
                 super__Vector_base<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start, ppVar6 == (pointer)0x0)) {
      SpatialSort::Fill(&_vertexFinder,this_02->mVertices,this_02->mNumVertices,0xc,true);
    }
    else {
      local_358 = ppVar6 + uVar21;
    }
    verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&verticesFound,10);
    uVar13 = aiMesh::GetNumColorChannels(this_02);
    bVar28 = true;
    if (uVar13 == 0) {
      uVar13 = aiMesh::GetNumUVChannels(this_02);
      bVar28 = 1 < uVar13;
    }
    uVar21 = (ulong)this_02->mNumAnimMeshes;
    uniqueAnimatedVertices.
    super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqueAnimatedVertices.
    super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uniqueAnimatedVertices.
    super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (uVar21 != 0) {
      std::
      vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
      ::resize(&uniqueAnimatedVertices,uVar21);
      puVar24 = local_3c0;
      lVar25 = 0;
      for (uVar22 = 0; uVar22 < this_02->mNumAnimMeshes; uVar22 = uVar22 + 1) {
        std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
                  ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                   ((long)&((uniqueAnimatedVertices.
                             super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar25),(ulong)*puVar24);
        lVar25 = lVar25 + 0x18;
      }
    }
    local_3b0 = CONCAT44(local_3b0._4_4_,(uint)bVar28);
    for (local_3c4 = 0; local_3c4 < *puVar24; local_3c4 = local_3c4 + 1) {
      iVar14 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&usedVertexIndices._M_h,&local_3c4);
      if (iVar14.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        Vertex::Vertex((Vertex *)&avf,this_02,local_3c4);
        SpatialSort::FindIdenticalPositions(&local_358->first,(aiVector3D *)&avf,&verticesFound);
        uVar13 = 0;
        while( true ) {
          if ((ulong)((long)verticesFound.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)verticesFound.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) <= (ulong)uVar13) break;
          uVar4 = replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start
                  [verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar13]];
          lVar25 = (long)(int)uVar4;
          if (-1 < lVar25) {
            bVar28 = anon_unknown.dwarf_acc57::areVerticesEqual
                               ((Vertex *)&avf,
                                uniqueVertices.
                                super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar25,SUB81(local_3b0,0)
                               );
            if (bVar28) {
              if (uVar21 == 0) {
LAB_003171e0:
                replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[local_3c4] = uVar4 | 0x80000000;
                puVar24 = local_3c0;
                goto LAB_00317204;
              }
              lVar26 = 0;
              uVar22 = 0;
              do {
                if (this_02->mNumAnimMeshes <= uVar22) goto LAB_003171e0;
                lVar19 = *(long *)((long)&((uniqueAnimatedVertices.
                                            super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar26);
                Vertex::Vertex(&aniMeshVertex,this_02->mAnimMeshes[uVar22],local_3c4);
                bVar28 = anon_unknown.dwarf_acc57::areVerticesEqual
                                   (&aniMeshVertex,(Vertex *)(lVar19 + lVar25 * 0x110),
                                    SUB81(local_3b0,0));
                uVar22 = uVar22 + 1;
                lVar26 = lVar26 + 0x18;
                this_02 = local_3b8;
              } while (bVar28);
            }
          }
          uVar13 = uVar13 + 1;
        }
        replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[local_3c4] =
             (uint)(((long)uniqueVertices.
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)uniqueVertices.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x110);
        std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::push_back
                  (&uniqueVertices,(value_type *)&avf);
        puVar24 = local_3c0;
        if (uVar21 != 0) {
          lVar25 = 0;
          for (uVar22 = 0; uVar22 < this_02->mNumAnimMeshes; uVar22 = uVar22 + 1) {
            Vertex::Vertex(&aniMeshVertex,this_02->mAnimMeshes[uVar22],local_3c4);
            std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::push_back
                      ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                       ((long)&((uniqueAnimatedVertices.
                                 super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar25),&aniMeshVertex);
            lVar25 = lVar25 + 0x18;
          }
        }
      }
LAB_00317204:
    }
    bVar28 = DefaultLogger::isNullLogger();
    if ((!bVar28) && (pLVar15 = DefaultLogger::get(), pLVar15->m_Severity == VERBOSE)) {
      pLVar15 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[6]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&avf,
                 (char (*) [6])0x5bc9d3);
      std::ostream::_M_insert<unsigned_long>((ulong)&avf);
      puVar24 = local_3c0;
      std::operator<<((ostream *)&avf," (");
      pcVar23 = "unnamed";
      if ((this_02->mName).length != 0) {
        pcVar23 = (this_02->mName).data;
      }
      std::operator<<((ostream *)&avf,pcVar23);
      std::operator<<((ostream *)&avf,") | Verts in: ");
      this_01 = (ostream *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&avf,
                          puVar24);
      std::operator<<(this_01," out: ");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::operator<<(this_01," | ~");
      uVar22 = (ulong)*puVar24;
      std::ostream::operator<<
                (this_01,((float)(((long)uniqueVertices.
                                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)uniqueVertices.
                                        super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / -0x110 + uVar22
                                 ) / (float)uVar22) * 100.0);
      std::operator<<(this_01,"%");
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar15,(char *)aniMeshVertex.position._0_8_);
      std::__cxx11::string::~string((string *)&aniMeshVertex);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&avf);
    }
    uVar22 = ((long)uniqueVertices.
                    super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)uniqueVertices.
                   super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x110;
    this_02->mNumVertices = (uint)uVar22;
    lVar25 = 0xc;
    if (this_02->mVertices != (aiVector3D *)0x0) {
      operator_delete__(this_02->mVertices);
      uVar13 = *local_3c0;
      uVar22 = (ulong)uVar13;
      uVar27 = uVar22 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar27);
      if (uVar13 != 0) {
        memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
      }
      this_02->mVertices = paVar16;
      lVar26 = 0;
      lVar19 = 0;
      for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
        paVar16 = this_02->mVertices;
        *(undefined4 *)((long)&paVar16->z + lVar19) =
             *(undefined4 *)
              ((long)(uniqueVertices.
                      super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start)->texcoords + lVar26 + -0x28);
        *(undefined8 *)((long)&paVar16->x + lVar19) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((uniqueVertices.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar26)
        ;
        uVar22 = (ulong)this_02->mNumVertices;
        lVar19 = lVar19 + 0xc;
        lVar26 = lVar26 + 0x110;
      }
    }
    if (this_02->mNormals != (aiVector3D *)0x0) {
      operator_delete__(this_02->mNormals);
      uVar13 = *local_3c0;
      uVar22 = (ulong)uVar13;
      uVar27 = uVar22 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar27);
      if (uVar13 != 0) {
        memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
      }
      this_02->mNormals = paVar16;
      lVar26 = 0;
      for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
        paVar16 = this_02->mNormals;
        *(undefined4 *)((long)&paVar16->z + lVar26) =
             *(undefined4 *)
              ((long)(uniqueVertices.
                      super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start)->texcoords + lVar25 + -0x28);
        *(undefined8 *)((long)&paVar16->x + lVar26) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((uniqueVertices.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar25)
        ;
        uVar22 = (ulong)this_02->mNumVertices;
        lVar26 = lVar26 + 0xc;
        lVar25 = lVar25 + 0x110;
      }
    }
    if (this_02->mTangents != (aiVector3D *)0x0) {
      operator_delete__(this_02->mTangents);
      uVar13 = *local_3c0;
      uVar22 = (ulong)uVar13;
      uVar27 = uVar22 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar27);
      if (uVar13 != 0) {
        memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
      }
      lVar25 = 0x18;
      this_02->mTangents = paVar16;
      lVar26 = 0;
      for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
        paVar16 = this_02->mTangents;
        *(undefined4 *)((long)&paVar16->z + lVar26) =
             *(undefined4 *)
              ((long)(uniqueVertices.
                      super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start)->texcoords + lVar25 + -0x28);
        *(undefined8 *)((long)&paVar16->x + lVar26) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((uniqueVertices.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar25)
        ;
        uVar22 = (ulong)this_02->mNumVertices;
        lVar26 = lVar26 + 0xc;
        lVar25 = lVar25 + 0x110;
      }
    }
    if (this_02->mBitangents != (aiVector3D *)0x0) {
      operator_delete__(this_02->mBitangents);
      uVar13 = *local_3c0;
      uVar22 = (ulong)uVar13;
      uVar27 = uVar22 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar27);
      if (uVar13 != 0) {
        memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
      }
      lVar25 = 0x24;
      this_02->mBitangents = paVar16;
      lVar26 = 0;
      for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
        paVar16 = this_02->mBitangents;
        *(undefined4 *)((long)&paVar16->z + lVar26) =
             *(undefined4 *)
              ((long)(uniqueVertices.
                      super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start)->texcoords + lVar25 + -0x28);
        *(undefined8 *)((long)&paVar16->x + lVar26) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((uniqueVertices.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar25)
        ;
        uVar22 = (ulong)this_02->mNumVertices;
        lVar26 = lVar26 + 0xc;
        lVar25 = lVar25 + 0x110;
      }
    }
    lVar26 = 0x90;
    lVar25 = 0;
    while (((lVar25 != 8 && (local_3b8->mColors[lVar25] != (aiColor4D *)0x0)) && ((int)uVar22 != 0))
          ) {
      operator_delete__(local_3b8->mColors[lVar25]);
      uVar13 = *local_3c0;
      uVar22 = (ulong)uVar13;
      paVar17 = (aiColor4D *)operator_new__(uVar22 << 4);
      if (uVar13 != 0) {
        memset(paVar17,0,uVar22 << 4);
      }
      local_3b8->mColors[lVar25] = paVar17;
      lVar20 = 0;
      lVar19 = lVar26;
      for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
        puVar1 = (undefined4 *)
                 ((long)&(((Vertex *)
                          ((uniqueVertices.
                            super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                            _M_impl.super__Vector_impl_data._M_start)->texcoords + -4))->position).x
                 + lVar19);
        uVar10 = puVar1[1];
        uVar11 = puVar1[2];
        uVar12 = puVar1[3];
        puVar2 = (undefined4 *)((long)&local_3b8->mColors[lVar25]->r + lVar20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar2[2] = uVar11;
        puVar2[3] = uVar12;
        uVar22 = (ulong)local_3b8->mNumVertices;
        lVar20 = lVar20 + 0x10;
        lVar19 = lVar19 + 0x110;
      }
      lVar25 = lVar25 + 1;
      lVar26 = lVar26 + 0x10;
    }
    lVar25 = 0x30;
    lVar26 = 0;
    while (((lVar26 != 8 && (local_3b8->mTextureCoords[lVar26] != (aiVector3D *)0x0)) &&
           ((int)uVar22 != 0))) {
      operator_delete__(local_3b8->mTextureCoords[lVar26]);
      uVar13 = *local_3c0;
      uVar22 = (ulong)uVar13;
      uVar27 = uVar22 * 0xc;
      paVar16 = (aiVector3D *)operator_new__(uVar27);
      if (uVar13 != 0) {
        memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
      }
      local_3b8->mTextureCoords[lVar26] = paVar16;
      lVar20 = 0;
      lVar19 = lVar25;
      for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
        paVar16 = local_3b8->mTextureCoords[lVar26];
        *(undefined4 *)((long)&paVar16->z + lVar20) =
             *(undefined4 *)
              ((long)(uniqueVertices.
                      super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start)->texcoords + lVar19 + -0x28);
        *(undefined8 *)((long)&paVar16->x + lVar20) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((uniqueVertices.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar19)
        ;
        uVar22 = (ulong)local_3b8->mNumVertices;
        lVar20 = lVar20 + 0xc;
        lVar19 = lVar19 + 0x110;
      }
      lVar26 = lVar26 + 1;
      lVar25 = lVar25 + 0xc;
    }
    if (uVar21 != 0) {
      for (uVar21 = 0; uVar21 < local_3b8->mNumAnimMeshes; uVar21 = uVar21 + 1) {
        paVar7 = local_3b8->mAnimMeshes[uVar21];
        pvVar3 = uniqueAnimatedVertices.
                 super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar21;
        paVar7->mNumVertices =
             (uint)(((long)uniqueAnimatedVertices.
                           super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)uniqueAnimatedVertices.
                          super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x110);
        if (paVar7->mVertices != (aiVector3D *)0x0) {
          operator_delete__(paVar7->mVertices);
          uVar13 = paVar7->mNumVertices;
          uVar22 = (ulong)uVar13;
          uVar27 = uVar22 * 0xc;
          paVar16 = (aiVector3D *)operator_new__(uVar27);
          if (uVar13 != 0) {
            memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
          }
          paVar7->mVertices = paVar16;
          lVar25 = 0;
          lVar26 = 0;
          for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
            pVVar8 = (pvVar3->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar16 = paVar7->mVertices;
            *(undefined4 *)((long)&paVar16->z + lVar26) =
                 *(undefined4 *)((long)pVVar8->texcoords + lVar25 + -0x28);
            *(undefined8 *)((long)&paVar16->x + lVar26) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar8->texcoords + -4))->position).x + lVar25)
            ;
            uVar22 = (ulong)paVar7->mNumVertices;
            lVar26 = lVar26 + 0xc;
            lVar25 = lVar25 + 0x110;
          }
        }
        if (paVar7->mNormals != (aiVector3D *)0x0) {
          operator_delete__(paVar7->mNormals);
          uVar13 = paVar7->mNumVertices;
          uVar22 = (ulong)uVar13;
          uVar27 = uVar22 * 0xc;
          paVar16 = (aiVector3D *)operator_new__(uVar27);
          lVar25 = 0xc;
          if (uVar13 != 0) {
            memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
          }
          paVar7->mNormals = paVar16;
          lVar26 = 0;
          for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
            pVVar8 = (pvVar3->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar16 = paVar7->mNormals;
            *(undefined4 *)((long)&paVar16->z + lVar26) =
                 *(undefined4 *)((long)pVVar8->texcoords + lVar25 + -0x28);
            *(undefined8 *)((long)&paVar16->x + lVar26) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar8->texcoords + -4))->position).x + lVar25)
            ;
            uVar22 = (ulong)paVar7->mNumVertices;
            lVar26 = lVar26 + 0xc;
            lVar25 = lVar25 + 0x110;
          }
        }
        if (paVar7->mTangents != (aiVector3D *)0x0) {
          operator_delete__(paVar7->mTangents);
          uVar13 = paVar7->mNumVertices;
          uVar22 = (ulong)uVar13;
          uVar27 = uVar22 * 0xc;
          paVar16 = (aiVector3D *)operator_new__(uVar27);
          if (uVar13 != 0) {
            memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
          }
          paVar7->mTangents = paVar16;
          lVar25 = 0x18;
          lVar26 = 0;
          for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
            pVVar8 = (pvVar3->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar16 = paVar7->mTangents;
            *(undefined4 *)((long)&paVar16->z + lVar26) =
                 *(undefined4 *)((long)pVVar8->texcoords + lVar25 + -0x28);
            *(undefined8 *)((long)&paVar16->x + lVar26) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar8->texcoords + -4))->position).x + lVar25)
            ;
            uVar22 = (ulong)paVar7->mNumVertices;
            lVar26 = lVar26 + 0xc;
            lVar25 = lVar25 + 0x110;
          }
        }
        if (paVar7->mBitangents != (aiVector3D *)0x0) {
          operator_delete__(paVar7->mBitangents);
          uVar13 = paVar7->mNumVertices;
          uVar22 = (ulong)uVar13;
          uVar27 = uVar22 * 0xc;
          paVar16 = (aiVector3D *)operator_new__(uVar27);
          if (uVar13 != 0) {
            memset(paVar16,0,uVar27 - (uVar27 - 0xc) % 0xc);
          }
          paVar7->mBitangents = paVar16;
          lVar25 = 0x24;
          lVar26 = 0;
          for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
            pVVar8 = (pvVar3->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar16 = paVar7->mBitangents;
            *(undefined4 *)((long)&paVar16->z + lVar26) =
                 *(undefined4 *)((long)pVVar8->texcoords + lVar25 + -0x28);
            *(undefined8 *)((long)&paVar16->x + lVar26) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar8->texcoords + -4))->position).x + lVar25)
            ;
            uVar22 = (ulong)paVar7->mNumVertices;
            lVar26 = lVar26 + 0xc;
            lVar25 = lVar25 + 0x110;
          }
        }
        lVar25 = 0x90;
        for (lVar26 = 0; (lVar26 != 8 && (paVar7->mColors[lVar26] != (aiColor4D *)0x0));
            lVar26 = lVar26 + 1) {
          local_3b0 = lVar25;
          operator_delete__(paVar7->mColors[lVar26]);
          uVar13 = paVar7->mNumVertices;
          uVar22 = (ulong)uVar13 << 4;
          paVar17 = (aiColor4D *)operator_new__(uVar22);
          if (uVar13 != 0) {
            memset(paVar17,0,uVar22);
          }
          paVar7->mColors[lVar26] = paVar17;
          lVar25 = 0;
          uVar22 = local_3b0;
          for (uVar27 = 0; uVar27 < paVar7->mNumVertices; uVar27 = uVar27 + 1) {
            puVar1 = (undefined4 *)
                     ((long)&(((Vertex *)
                              (((pvVar3->
                                super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>)
                                ._M_impl.super__Vector_impl_data._M_start)->texcoords + -4))->
                             position).x + uVar22);
            uVar10 = puVar1[1];
            uVar11 = puVar1[2];
            uVar12 = puVar1[3];
            puVar2 = (undefined4 *)((long)&paVar7->mColors[lVar26]->r + lVar25);
            *puVar2 = *puVar1;
            puVar2[1] = uVar10;
            puVar2[2] = uVar11;
            puVar2[3] = uVar12;
            lVar25 = lVar25 + 0x10;
            uVar22 = uVar22 + 0x110;
          }
          lVar25 = local_3b0 + 0x10;
        }
        lVar25 = 0x30;
        for (lVar26 = 0; (lVar26 != 8 && (paVar7->mTextureCoords[lVar26] != (aiVector3D *)0x0));
            lVar26 = lVar26 + 1) {
          local_3b0 = lVar25;
          operator_delete__(paVar7->mTextureCoords[lVar26]);
          uVar13 = paVar7->mNumVertices;
          uVar22 = (ulong)uVar13 * 0xc;
          paVar16 = (aiVector3D *)operator_new__(uVar22);
          if (uVar13 != 0) {
            memset(paVar16,0,uVar22 - (uVar22 - 0xc) % 0xc);
          }
          paVar7->mTextureCoords[lVar26] = paVar16;
          lVar25 = 0;
          uVar22 = local_3b0;
          for (uVar27 = 0; uVar27 < paVar7->mNumVertices; uVar27 = uVar27 + 1) {
            pVVar8 = (pvVar3->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar16 = paVar7->mTextureCoords[lVar26];
            *(undefined4 *)((long)&paVar16->z + lVar25) =
                 *(undefined4 *)((long)pVVar8->texcoords + uVar22 + -0x28);
            *(undefined8 *)((long)&paVar16->x + lVar25) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar8->texcoords + -4))->position).x + uVar22)
            ;
            lVar25 = lVar25 + 0xc;
            uVar22 = uVar22 + 0x110;
          }
          lVar25 = local_3b0 + 0xc;
        }
      }
    }
    for (uVar21 = 0; uVar21 < local_3b8->mNumFaces; uVar21 = uVar21 + 1) {
      paVar5 = local_3b8->mFaces;
      for (uVar22 = 0; uVar22 < paVar5[uVar21].mNumIndices; uVar22 = uVar22 + 1) {
        puVar24 = paVar5[uVar21].mIndices;
        puVar24[uVar22] =
             replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[puVar24[uVar22]] & 0x7fffffff;
      }
    }
    lVar25 = 0;
    while (lVar25 < (int)local_3b8->mNumBones) {
      paVar9 = local_3b8->mBones[lVar25];
      avf = (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
             *)0x0;
      paStack_2b0 = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      local_3b0 = lVar25;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)&avf,
                 (ulong)paVar9->mNumWeights);
      if (paVar9->mWeights == (aiVertexWeight *)0x0) {
        pLVar15 = DefaultLogger::get();
        Logger::error(pLVar15,"X-Export: aiBone shall contain weights, but pointer to them is NULL."
                     );
      }
      else {
        for (uVar21 = 0; uVar21 < paVar9->mNumWeights; uVar21 = uVar21 + 1) {
          paVar18 = paVar9->mWeights;
          if (-1 < (int)replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start[paVar18[uVar21].mVertexId]) {
            aniMeshVertex.position.y = paVar18[uVar21].mWeight;
            aniMeshVertex.position.x =
                 (float)replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start[paVar18[uVar21].mVertexId];
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                      ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)&avf,
                       (value_type *)&aniMeshVertex);
          }
        }
      }
      if (paStack_2b0 != (pointer)avf) {
        if (paVar9->mWeights != (aiVertexWeight *)0x0) {
          operator_delete__(paVar9->mWeights);
        }
        __src = avf;
        uVar22 = (long)paStack_2b0 - (long)avf >> 3;
        paVar9->mNumWeights = (uint)uVar22;
        uVar22 = uVar22 & 0xffffffff;
        uVar21 = uVar22 * 8;
        paVar18 = (aiVertexWeight *)operator_new__(uVar21);
        if (uVar22 != 0) {
          memset(paVar18,0,uVar21);
        }
        paVar9->mWeights = paVar18;
        memcpy(paVar18,__src,(ulong)paVar9->mNumWeights << 3);
      }
      std::_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~_Vector_base
                ((_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)&avf);
      lVar25 = local_3b0 + 1;
    }
    uVar13 = *local_3c0;
    std::
    vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ::~vector(&uniqueAnimatedVertices);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    SpatialSort::~SpatialSort(&_vertexFinder);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::~_Vector_base
              (&uniqueVertices.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&usedVertexIndices._M_h);
  }
  return uVar13;
}

Assistant:

int JoinVerticesProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    static_assert( AI_MAX_NUMBER_OF_COLOR_SETS    == 8, "AI_MAX_NUMBER_OF_COLOR_SETS    == 8");
	static_assert( AI_MAX_NUMBER_OF_TEXTURECOORDS == 8, "AI_MAX_NUMBER_OF_TEXTURECOORDS == 8");

    // Return early if we don't have any positions
    if (!pMesh->HasPositions() || !pMesh->HasFaces()) {
        return 0;
    }

    // We should care only about used vertices, not all of them
    // (this can happen due to original file vertices buffer being used by
    // multiple meshes)
    std::unordered_set<unsigned int> usedVertexIndices;
    usedVertexIndices.reserve(pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            usedVertexIndices.insert(face.mIndices[b]);
        }
    }

    // We'll never have more vertices afterwards.
    std::vector<Vertex> uniqueVertices;
    uniqueVertices.reserve( pMesh->mNumVertices);

    // For each vertex the index of the vertex it was replaced by.
    // Since the maximal number of vertices is 2^31-1, the most significand bit can be used to mark
    //  whether a new vertex was created for the index (true) or if it was replaced by an existing
    //  unique vertex (false). This saves an additional std::vector<bool> and greatly enhances
    //  branching performance.
    static_assert(AI_MAX_VERTICES == 0x7fffffff, "AI_MAX_VERTICES == 0x7fffffff");
    std::vector<unsigned int> replaceIndex( pMesh->mNumVertices, 0xffffffff);

    // float posEpsilonSqr;
    SpatialSort* vertexFinder = NULL;
    SpatialSort _vertexFinder;

    typedef std::pair<SpatialSort,float> SpatPair;
    if (shared) {
        std::vector<SpatPair >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)    {
            SpatPair& blubb = (*avf)[meshIndex];
            vertexFinder  = &blubb.first;
            // posEpsilonSqr = blubb.second;
        }
    }
    if (!vertexFinder)  {
        // bad, need to compute it.
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        // posEpsilonSqr = ComputePositionEpsilon(pMesh);
    }

    // Again, better waste some bytes than a realloc ...
    std::vector<unsigned int> verticesFound;
    verticesFound.reserve(10);

    // Run an optimized code path if we don't have multiple UVs or vertex colors.
    // This should yield false in more than 99% of all imports ...
    const bool complex = ( pMesh->GetNumColorChannels() > 0 || pMesh->GetNumUVChannels() > 1);
    const bool hasAnimMeshes = pMesh->mNumAnimMeshes > 0;

    // We'll never have more vertices afterwards.
    std::vector<std::vector<Vertex>> uniqueAnimatedVertices;
    if (hasAnimMeshes) {
        uniqueAnimatedVertices.resize(pMesh->mNumAnimMeshes);
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            uniqueAnimatedVertices[animMeshIndex].reserve(pMesh->mNumVertices);
        }
    }

    // Now check each vertex if it brings something new to the table
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)  {
        if (usedVertexIndices.find(a) == usedVertexIndices.end()) {
            continue;
        }

        // collect the vertex data
        Vertex v(pMesh,a);

        // collect all vertices that are close enough to the given position
        vertexFinder->FindIdenticalPositions( v.position, verticesFound);
        unsigned int matchIndex = 0xffffffff;

        // check all unique vertices close to the position if this vertex is already present among them
        for( unsigned int b = 0; b < verticesFound.size(); b++) {
            const unsigned int vidx = verticesFound[b];
            const unsigned int uidx = replaceIndex[ vidx];
            if( uidx & 0x80000000)
                continue;

            const Vertex& uv = uniqueVertices[ uidx];

            if (!areVerticesEqual(v, uv, complex)) {
                continue;
            }

            if (hasAnimMeshes) {
                // If given vertex is animated, then it has to be preserver 1 to 1 (base mesh and animated mesh require same topology)
                // NOTE: not doing this totaly breaks anim meshes as they don't have their own faces (they use pMesh->mFaces)
                bool breaksAnimMesh = false;
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    const Vertex& animatedUV = uniqueAnimatedVertices[animMeshIndex][ uidx];
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    if (!areVerticesEqual(aniMeshVertex, animatedUV, complex)) {
                        breaksAnimMesh = true;
                        break;
                    }
                }
                if (breaksAnimMesh) {
                    continue;
                }
            }

            // we're still here -> this vertex perfectly matches our given vertex
            matchIndex = uidx;
            break;
        }

        // found a replacement vertex among the uniques?
        if( matchIndex != 0xffffffff)
        {
            // store where to found the matching unique vertex
            replaceIndex[a] = matchIndex | 0x80000000;
        }
        else
        {
            // no unique vertex matches it up to now -> so add it
            replaceIndex[a] = (unsigned int)uniqueVertices.size();
            uniqueVertices.push_back( v);
            if (hasAnimMeshes) {
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    uniqueAnimatedVertices[animMeshIndex].push_back(aniMeshVertex);
                }
            }
        }
    }

    if (!DefaultLogger::isNullLogger() && DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE)    {
        ASSIMP_LOG_DEBUG_F(
            "Mesh ",meshIndex,
            " (",
            (pMesh->mName.length ? pMesh->mName.data : "unnamed"),
            ") | Verts in: ",pMesh->mNumVertices,
            " out: ",
            uniqueVertices.size(),
            " | ~",
            ((pMesh->mNumVertices - uniqueVertices.size()) / (float)pMesh->mNumVertices) * 100.f,
            "%"
        );
    }

    updateXMeshVertices(pMesh, uniqueVertices);
    if (hasAnimMeshes) {
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            updateXMeshVertices(pMesh->mAnimMeshes[animMeshIndex], uniqueAnimatedVertices[animMeshIndex]);
        }
    }

    // adjust the indices in all faces
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            face.mIndices[b] = replaceIndex[face.mIndices[b]] & ~0x80000000;
        }
    }

    // adjust bone vertex weights.
    for( int a = 0; a < (int)pMesh->mNumBones; a++) {
        aiBone* bone = pMesh->mBones[a];
        std::vector<aiVertexWeight> newWeights;
        newWeights.reserve( bone->mNumWeights);

        if ( NULL != bone->mWeights ) {
            for ( unsigned int b = 0; b < bone->mNumWeights; b++ ) {
                const aiVertexWeight& ow = bone->mWeights[ b ];
                // if the vertex is a unique one, translate it
                if ( !( replaceIndex[ ow.mVertexId ] & 0x80000000 ) ) {
                    aiVertexWeight nw;
                    nw.mVertexId = replaceIndex[ ow.mVertexId ];
                    nw.mWeight = ow.mWeight;
                    newWeights.push_back( nw );
                }
            }
        } else {
            ASSIMP_LOG_ERROR( "X-Export: aiBone shall contain weights, but pointer to them is NULL." );
        }

        if (newWeights.size() > 0) {
            // kill the old and replace them with the translated weights
            delete [] bone->mWeights;
            bone->mNumWeights = (unsigned int)newWeights.size();

            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            memcpy( bone->mWeights, &newWeights[0], bone->mNumWeights * sizeof( aiVertexWeight));
        }
    }
    return pMesh->mNumVertices;
}